

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

EmptyArgumentSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::EmptyArgumentSyntax,slang::parsing::Token&>
          (BumpAllocator *this,Token *args)

{
  Token placeholder;
  EmptyArgumentSyntax *this_00;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (EmptyArgumentSyntax *)allocate(this,0x20,8);
  placeholder.kind = args->kind;
  placeholder._2_1_ = args->field_0x2;
  placeholder.numFlags.raw = (args->numFlags).raw;
  placeholder.rawLen = args->rawLen;
  placeholder.info = args->info;
  slang::syntax::EmptyArgumentSyntax::EmptyArgumentSyntax(this_00,placeholder);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }